

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O1

CURLcode rtsp_rtp_readwrite(SessionHandle *data,connectdata *conn,ssize_t *nread,_Bool *readmore)

{
  anon_union_264_9_0449b319_for_proto *paVar1;
  int *piVar2;
  char **ppcVar3;
  SessionHandle *data_00;
  bool bVar4;
  int iVar5;
  void *pvVar6;
  curl_write_callback p_Var7;
  size_t sVar8;
  ssize_t *__n;
  char *unaff_RBP;
  char *fmt;
  CURLcode CVar9;
  ssize_t *psVar10;
  size_t sVar11;
  CURLcode local_5c;
  
  paVar1 = &conn->proto;
  if ((conn->proto).generic == (void *)0x0) {
    unaff_RBP = (data->req).str;
    __n = (ssize_t *)*nread;
LAB_00573a35:
    local_5c = CURLE_OUT_OF_MEMORY;
    do {
      if (((long)__n < 1) || (*unaff_RBP != '$')) goto LAB_00573b93;
      if ((long)__n < 5) {
        *readmore = true;
        goto LAB_00573b93;
      }
      *(uint *)((long)&conn->proto + 0x10) = (uint)(byte)unaff_RBP[1];
      sVar11 = (ulong)(ushort)(*(ushort *)(unaff_RBP + 2) << 8 | *(ushort *)(unaff_RBP + 2) >> 8) +
               4;
      psVar10 = (ssize_t *)((long)__n - sVar11);
      if ((long)__n < (long)sVar11) {
        *readmore = true;
        iVar5 = 5;
        psVar10 = __n;
      }
      else {
        data_00 = conn->data;
        p_Var7 = (data_00->set).fwrite_rtp;
        if (p_Var7 == (curl_write_callback)0x0) {
          p_Var7 = (data_00->set).fwrite_func;
        }
        sVar8 = (*p_Var7)(unaff_RBP,1,sVar11,(data_00->set).rtp_out);
        fmt = "Cannot pause RTP";
        if ((sVar8 == 0x10000001) || (fmt = "Failed writing RTP data", sVar8 != sVar11)) {
          bVar4 = false;
          Curl_failf(data_00,fmt);
          CVar9 = CURLE_WRITE_ERROR;
        }
        else {
          CVar9 = CURLE_OK;
          bVar4 = true;
        }
        if (bVar4) {
          unaff_RBP = unaff_RBP + sVar11;
          iVar5 = 0;
          if ((data->set).rtspreq == RTSPREQ_RECEIVE) {
            piVar2 = &(data->req).keepon;
            *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
          }
        }
        else {
          Curl_failf(data,"Got an error writing an RTP packet");
          *readmore = false;
          if (paVar1->generic != (void *)0x0) {
            (*Curl_cfree)(paVar1->generic);
            (paVar1->ftpc).pp.cache = (char *)0x0;
          }
          (paVar1->ftpc).pp.cache = (char *)0x0;
          (conn->proto).ftpc.pp.cache_size = 0;
          iVar5 = 1;
          psVar10 = __n;
          local_5c = CVar9;
        }
      }
      __n = psVar10;
    } while (iVar5 == 0);
    if (iVar5 != 5) {
      return local_5c;
    }
LAB_00573b93:
    if ((__n == (ssize_t *)0x0) || (*unaff_RBP != '$')) {
      ppcVar3 = &(data->req).str;
      *ppcVar3 = *ppcVar3 + (*nread - (long)__n);
      *nread = (ssize_t)__n;
      if (paVar1->generic != (void *)0x0) {
        (*Curl_cfree)(paVar1->generic);
        (paVar1->ftpc).pp.cache = (char *)0x0;
      }
      (paVar1->ftpc).pp.cache = (char *)0x0;
      (conn->proto).ftpc.pp.cache_size = 0;
    }
    else {
      pvVar6 = (*Curl_cmalloc)((size_t)__n);
      if (pvVar6 == (void *)0x0) {
        if (paVar1->generic != (void *)0x0) {
          (*Curl_cfree)(paVar1->generic);
          (paVar1->ftpc).pp.cache = (char *)0x0;
        }
        (paVar1->ftpc).pp.cache = (char *)0x0;
        (conn->proto).ftpc.pp.cache_size = 0;
        goto LAB_00573c56;
      }
      memcpy(pvVar6,unaff_RBP,(size_t)__n);
      if (paVar1->generic != (void *)0x0) {
        (*Curl_cfree)(paVar1->generic);
        (paVar1->ftpc).pp.cache = (char *)0x0;
      }
      (conn->proto).generic = pvVar6;
      (conn->proto).rtspc.rtp_bufsize = (ssize_t)__n;
      *nread = 0;
    }
    CVar9 = CURLE_OK;
  }
  else {
    pvVar6 = (*Curl_crealloc)((conn->proto).generic,*nread + (conn->proto).ftpc.pp.cache_size);
    if (pvVar6 == (void *)0x0) {
      if (paVar1->generic != (void *)0x0) {
        (*Curl_cfree)(paVar1->generic);
        (paVar1->ftpc).pp.cache = (char *)0x0;
      }
      (paVar1->ftpc).pp.cache = (char *)0x0;
      (conn->proto).ftpc.pp.cache_size = 0;
      __n = nread;
    }
    else {
      (conn->proto).generic = pvVar6;
      memcpy((void *)((conn->proto).ftpc.pp.cache_size + (long)pvVar6),(data->req).str,*nread);
      unaff_RBP = (conn->proto).ftpc.pp.cache;
      __n = (ssize_t *)((conn->proto).ftpc.pp.cache_size + *nread);
      (conn->proto).rtspc.rtp_bufsize = (ssize_t)__n;
    }
    if (pvVar6 != (void *)0x0) goto LAB_00573a35;
LAB_00573c56:
    CVar9 = CURLE_OUT_OF_MEMORY;
  }
  return CVar9;
}

Assistant:

static CURLcode rtsp_rtp_readwrite(struct SessionHandle *data,
                                   struct connectdata *conn,
                                   ssize_t *nread,
                                   bool *readmore) {
  struct SingleRequest *k = &data->req;
  struct rtsp_conn *rtspc = &(conn->proto.rtspc);

  char *rtp; /* moving pointer to rtp data */
  ssize_t rtp_dataleft; /* how much data left to parse in this round */
  char *scratch;
  CURLcode result;

  if(rtspc->rtp_buf) {
    /* There was some leftover data the last time. Merge buffers */
    char *newptr = realloc(rtspc->rtp_buf, rtspc->rtp_bufsize + *nread);
    if(!newptr) {
      Curl_safefree(rtspc->rtp_buf);
      rtspc->rtp_buf = NULL;
      rtspc->rtp_bufsize = 0;
      return CURLE_OUT_OF_MEMORY;
    }
    rtspc->rtp_buf = newptr;
    memcpy(rtspc->rtp_buf + rtspc->rtp_bufsize, k->str, *nread);
    rtspc->rtp_bufsize += *nread;
    rtp = rtspc->rtp_buf;
    rtp_dataleft = rtspc->rtp_bufsize;
  }
  else {
    /* Just parse the request buffer directly */
    rtp = k->str;
    rtp_dataleft = *nread;
  }

  while((rtp_dataleft > 0) &&
        (rtp[0] == '$')) {
    if(rtp_dataleft > 4) {
      int rtp_length;

      /* Parse the header */
      /* The channel identifier immediately follows and is 1 byte */
      rtspc->rtp_channel = RTP_PKT_CHANNEL(rtp);

      /* The length is two bytes */
      rtp_length = RTP_PKT_LENGTH(rtp);

      if(rtp_dataleft < rtp_length + 4) {
        /* Need more - incomplete payload*/
        *readmore = TRUE;
        break;
      }
      else {
        /* We have the full RTP interleaved packet
         * Write out the header including the leading '$' */
        DEBUGF(infof(data, "RTP write channel %d rtp_length %d\n",
              rtspc->rtp_channel, rtp_length));
        result = rtp_client_write(conn, &rtp[0], rtp_length + 4);
        if(result) {
          failf(data, "Got an error writing an RTP packet");
          *readmore = FALSE;
          Curl_safefree(rtspc->rtp_buf);
          rtspc->rtp_buf = NULL;
          rtspc->rtp_bufsize = 0;
          return result;
        }

        /* Move forward in the buffer */
        rtp_dataleft -= rtp_length + 4;
        rtp += rtp_length + 4;

        if(data->set.rtspreq == RTSPREQ_RECEIVE) {
          /* If we are in a passive receive, give control back
           * to the app as often as we can.
           */
          k->keepon &= ~KEEP_RECV;
        }
      }
    }
    else {
      /* Need more - incomplete header */
      *readmore = TRUE;
      break;
    }
  }

  if(rtp_dataleft != 0 && rtp[0] == '$') {
    DEBUGF(infof(data, "RTP Rewinding %zd %s\n", rtp_dataleft,
          *readmore ? "(READMORE)" : ""));

    /* Store the incomplete RTP packet for a "rewind" */
    scratch = malloc(rtp_dataleft);
    if(!scratch) {
      Curl_safefree(rtspc->rtp_buf);
      rtspc->rtp_buf = NULL;
      rtspc->rtp_bufsize = 0;
      return CURLE_OUT_OF_MEMORY;
    }
    memcpy(scratch, rtp, rtp_dataleft);
    Curl_safefree(rtspc->rtp_buf);
    rtspc->rtp_buf = scratch;
    rtspc->rtp_bufsize = rtp_dataleft;

    /* As far as the transfer is concerned, this data is consumed */
    *nread = 0;
    return CURLE_OK;
  }
  else {
    /* Fix up k->str to point just after the last RTP packet */
    k->str += *nread - rtp_dataleft;

    /* either all of the data has been read or...
     * rtp now points at the next byte to parse
     */
    if(rtp_dataleft > 0)
      DEBUGASSERT(k->str[0] == rtp[0]);

    DEBUGASSERT(rtp_dataleft <= *nread); /* sanity check */

    *nread = rtp_dataleft;
  }

  /* If we get here, we have finished with the leftover/merge buffer */
  Curl_safefree(rtspc->rtp_buf);
  rtspc->rtp_buf = NULL;
  rtspc->rtp_bufsize = 0;

  return CURLE_OK;
}